

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TargetType targetType;
  char *pcVar5;
  size_t sVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  uint c;
  char cVar15;
  undefined3 in_register_00000089;
  string launcher;
  string cmd;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string workingDir;
  string dir;
  string shellCommand;
  string currentBinDir;
  string local_268;
  undefined4 local_248;
  allocator local_241;
  cmCustomCommandGenerator *local_240;
  string local_238;
  string local_218;
  string local_1f8;
  cmOutputConverter *local_1d8;
  cmGeneratorTarget *local_1d0;
  auto_ptr<cmRulePlaceholderExpander> local_1c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170 [2];
  string *local_160;
  undefined1 local_158 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  string local_70;
  string local_50;
  
  local_240 = ccg;
  local_1d0 = target;
  local_1c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
  local_160 = relative;
  if (CONCAT31(in_register_00000089,echo_comment) != 0) {
    pcVar5 = cmCustomCommandGenerator::GetComment(ccg);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      local_158._0_8_ = local_158 + 0x10;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,pcVar5,pcVar5 + sVar6);
      AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1c0,(string *)local_158,EchoGenerate,(EchoProgress *)0x0);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
    }
  }
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_180,pcVar5,(allocator *)local_158);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_1a0,local_240);
  if (local_1a0._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_180);
  }
  if (content != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(content,(char *)local_180,local_178);
  }
  iVar3 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    (this);
  local_1c8.x_ = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3);
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_50,pcVar5,(allocator *)local_158);
  local_1d8 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  c = 0;
  do {
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(local_240);
    if (uVar4 <= c) {
      CreateCDCommand(this,&local_1b8,(char *)local_180,local_160);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (local_1c0,*(undefined8 *)(local_1c0 + 8),
                 local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_1b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b8);
      cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (local_180 != local_170) {
        operator_delete(local_180,local_170[0] + 1);
      }
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_1f8,local_240,c);
    if (local_1f8._M_string_length != 0) {
      bVar2 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar2) {
        local_158._0_8_ = local_158 + 0x10;
        local_158._8_8_ = (char *)0x0;
        local_158[0x10] = '\0';
        if (local_1f8._M_string_length < 5) {
LAB_0044ba63:
          local_248 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_1f8);
          cmsys::SystemTools::LowerCase(&local_238,&local_268);
          std::__cxx11::string::operator=((string *)local_158,(string *)&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                     local_238.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,
                            CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                     local_268.field_2._M_local_buf[0]) + 1);
          }
          uVar7 = std::__cxx11::string::compare(local_158);
          if ((int)uVar7 != 0) {
            uVar7 = std::__cxx11::string::compare(local_158);
            if ((int)uVar7 != 0) goto LAB_0044ba63;
          }
          local_248 = (undefined4)CONCAT71((int7)((ulong)uVar7 >> 8),1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      else {
        local_248 = 0;
      }
      cmsys::SystemTools::ReplaceString(&local_1f8,"/./","/");
      cVar15 = (char)&local_1f8;
      lVar8 = std::__cxx11::string::find(cVar15,0x2f);
      if (local_1a0._M_string_length == 0) {
        MaybeConvertToRelativePath((string *)local_158,this,&local_50,&local_1f8);
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_158);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      lVar9 = std::__cxx11::string::find(cVar15,0x2f);
      if ((lVar8 != -1) && (lVar9 == -1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"./",&local_1f8);
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_158);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
        }
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"RULE_LAUNCH_CUSTOM","");
      pcVar5 = cmLocalGenerator::GetRuleLauncher
                         ((cmLocalGenerator *)this,local_1d0,(string *)local_158);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_158);
        psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(local_1d0);
        local_158._0_8_ = (psVar10->_M_dataplus)._M_p;
        targetType = cmGeneratorTarget::GetType(local_1d0);
        local_158._8_8_ = cmState::GetTargetTypeName(targetType);
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
        pvVar11 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(local_240);
        if ((pvVar11->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start !=
            (pvVar11->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::_M_assign((string *)&local_268);
          if (local_1a0._M_string_length == 0) {
            pcVar12 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
            std::__cxx11::string::string((string *)&local_70,pcVar12,&local_241);
            MaybeConvertToRelativePath(&local_218,this,&local_70,&local_268);
            std::__cxx11::string::operator=((string *)&local_268,(string *)&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          cmOutputConverter::ConvertToOutputFormat(&local_218,local_1d8,&local_268,SHELL);
          std::__cxx11::string::operator=((string *)&local_268,(string *)&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
        }
        sVar1 = local_238._M_string_length;
        local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_268._M_dataplus._M_p;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)&local_238,0,(char *)sVar1,(ulong)pcVar5);
        std::__cxx11::string::append((char *)&local_238);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_1c8.x_,local_1d8,&local_238,(RuleVariables *)local_158);
        if ((char *)local_238._M_string_length != (char *)0x0) {
          std::__cxx11::string::append((char *)&local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
      }
      MaybeConvertWatcomShellCommand((string *)local_158,this,&local_1f8);
      if ((char *)local_158._8_8_ == (char *)0x0) {
        cmOutputConverter::ConvertToOutputFormat(&local_268,local_1d8,&local_1f8,SHELL);
        std::__cxx11::string::operator=((string *)local_158,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
      }
      std::operator+(&local_268,&local_238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158)
      ;
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      cmCustomCommandGenerator::AppendArguments(local_240,c,&local_1f8);
      if (content != (ostream *)0x0) {
        if (local_1f8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)content + (int)content->_vptr_basic_ostream[-3]);
        }
        else {
          pcVar5 = local_1f8._M_dataplus._M_p + local_238._M_string_length;
          sVar6 = strlen(pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(content,pcVar5,sVar6);
        }
      }
      if (this->BorlandMakeCurlyHack == true) {
        uVar13 = std::__cxx11::string::find(cVar15,0x7b);
        if ((uVar13 != 0xffffffffffffffff) && (uVar13 < local_1f8._M_string_length - 1)) {
          uVar14 = std::__cxx11::string::find(cVar15,0x7d);
          if (uVar13 < uVar14) {
            std::__cxx11::string::substr((ulong)&local_268,(ulong)&local_1f8);
            std::__cxx11::string::append((char *)&local_268);
            std::__cxx11::string::substr((ulong)&local_218,(ulong)&local_1f8);
            std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_218._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::_M_assign((string *)&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,
                              CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                       local_268.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
      if ((char *)local_238._M_string_length == (char *)0x0) {
        if ((char)local_248 == '\0') {
          bVar2 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((!bVar2) || (*local_1f8._M_dataplus._M_p != '\"')) goto LAB_0044bff7;
          std::operator+(&local_268,"echo >nul && ",&local_1f8);
        }
        else {
          std::operator+(&local_268,"call ",&local_1f8);
        }
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
      }
LAB_0044bff7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1b8,&local_1f8);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    c = c + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      const char* val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (val && *val) {
        // Expand rules in the empty string.  It may insert the launcher and
        // perform replacements.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType = cmState::GetTargetTypeName(target->GetType());
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeConvertToRelativePath(
              this->GetCurrentBinaryDirectory(), output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        launcher += " ";
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            std::string hack_cmd = cmd.substr(0, lcurly);
            hack_cmd += "{{}";
            hack_cmd += cmd.substr(lcurly + 1);
            cmd = hack_cmd;
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = "call " + cmd;
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = "echo >nul && " + cmd;
        }
      }
      commands1.push_back(cmd);
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir.c_str(), relative);

  // push back the custom commands
  commands.insert(commands.end(), commands1.begin(), commands1.end());
}